

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

void __thiscall MeCab::FreeList<mecab_node_t>::~FreeList(FreeList<mecab_node_t> *this)

{
  pointer ppmVar1;
  mecab_node_t *pmVar2;
  ulong uVar3;
  
  this->_vptr_FreeList = (_func_int **)&PTR__FreeList_00139978;
  uVar3 = 0;
  while( true ) {
    this->li_ = uVar3;
    ppmVar1 = (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->freeList).
                      super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppmVar1 >> 3) <= uVar3) break;
    pmVar2 = ppmVar1[uVar3];
    if (pmVar2 != (mecab_node_t *)0x0) {
      operator_delete__(pmVar2);
      uVar3 = this->li_;
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::~_Vector_base
            (&(this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>);
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }